

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O3

int attlist1(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  code *pcVar1;
  int iVar2;
  
  if (tok < 0x12) {
    if (tok == 0xf) {
      return 0x21;
    }
    if (tok == 0x11) {
      pcVar1 = internalSubset;
      if (state->documentEntity == 0) {
        pcVar1 = externalSubset1;
      }
      iVar2 = 0x21;
      goto LAB_00175a98;
    }
  }
  else {
    iVar2 = 0x16;
    pcVar1 = attlist2;
    if ((tok == 0x12) || (tok == 0x29)) goto LAB_00175a98;
  }
  iVar2 = -1;
  pcVar1 = error;
  if ((tok == 0x1c) && (state->documentEntity == 0)) {
    return 0x3b;
  }
LAB_00175a98:
  state->handler = pcVar1;
  return iVar2;
}

Assistant:

static int PTRCALL
attlist1(PROLOG_STATE *state, int tok, const char *ptr, const char *end,
         const ENCODING *enc) {
  UNUSED_P(ptr);
  UNUSED_P(end);
  UNUSED_P(enc);
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_ATTLIST_NONE;
  case XML_TOK_DECL_CLOSE:
    setTopLevel(state);
    return XML_ROLE_ATTLIST_NONE;
  case XML_TOK_NAME:
  case XML_TOK_PREFIXED_NAME:
    state->handler = attlist2;
    return XML_ROLE_ATTRIBUTE_NAME;
  }
  return common(state, tok);
}